

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,vector_bagwell<unsigned_char_*,_16U> *buckets)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t n_00;
  int iVar3;
  uint j;
  long lVar4;
  pointer pppuVar5;
  uchar **ppuVar6;
  size_t sVar7;
  pointer pppuVar8;
  vector_bagwell<unsigned_char_*,_16U> *pvVar9;
  size_t __n;
  long lVar10;
  byte bVar11;
  byte bVar12;
  uint j_1;
  uint i_1;
  uchar **ppuVar13;
  ulong uVar14;
  long lVar15;
  array<unsigned_long,_256UL> bucketsize;
  size_t local_838 [257];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar6 = strings;
      do {
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar13 = ppuVar6; strings < ppuVar13; ppuVar13 = ppuVar13 + -1) {
          puVar2 = ppuVar13[-1];
          bVar11 = puVar2[depth];
          bVar12 = puVar1[depth];
          if ((bVar11 != 0) && (lVar4 = depth + 1, bVar11 == bVar12)) {
            do {
              bVar11 = puVar2[lVar4];
              bVar12 = puVar1[lVar4];
              if (bVar11 == 0) break;
              lVar4 = lVar4 + 1;
            } while (bVar11 == bVar12);
          }
          if (bVar11 <= bVar12) break;
          *ppuVar13 = puVar2;
        }
        iVar3 = (int)n;
        *ppuVar13 = puVar1;
        n = (size_t)(iVar3 - 1);
      } while (2 < iVar3);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      ppuVar6 = strings;
      do {
        lVar4 = 0;
        do {
          *(uchar *)((long)local_838 + lVar4) = ppuVar6[lVar4][depth];
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x20);
        lVar4 = 0;
        ppuVar13 = ppuVar6;
        do {
          vector_bagwell<unsigned_char_*,_16U>::push_back
                    (buckets + *(byte *)((long)local_838 + lVar4),ppuVar13);
          lVar4 = lVar4 + 1;
          ppuVar13 = ppuVar13 + 1;
        } while (lVar4 != 0x20);
        uVar14 = uVar14 + 0x20;
        ppuVar6 = ppuVar6 + 0x20;
      } while (uVar14 < (n & 0xffffffffffffffe0));
    }
    lVar4 = n - uVar14;
    if (uVar14 <= n && lVar4 != 0) {
      ppuVar6 = strings + uVar14;
      do {
        vector_bagwell<unsigned_char_*,_16U>::push_back(buckets + (*ppuVar6)[depth],ppuVar6);
        ppuVar6 = ppuVar6 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    lVar4 = 0;
    pvVar9 = buckets;
    do {
      if (pvVar9->_insertpos == (uchar **)0x0) {
        sVar7 = 0;
      }
      else {
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        sVar7 = (long)pvVar9->_insertpos +
                ((long)((1 << ((char)((uint)((int)pppuVar5 -
                                            *(int *)&(pvVar9->_index_block).
                                                                                                          
                                                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                               3U & 0x1f)) + -0x10) * 8 - (long)pppuVar5[-1]) >> 3;
      }
      local_838[lVar4] = sVar7;
      lVar4 = lVar4 + 1;
      pvVar9 = pvVar9 + 1;
    } while (lVar4 != 0x100);
    lVar4 = 0;
    lVar10 = 0;
    do {
      sVar7 = local_838[lVar4];
      if (sVar7 != 0) {
        pvVar9 = buckets + lVar4;
        ppuVar6 = strings + lVar10;
        pppuVar8 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pppuVar5 = (pvVar9->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (8 < (ulong)((long)pppuVar5 - (long)pppuVar8)) {
          lVar15 = 0x10;
          uVar14 = 1;
          do {
            if (lVar15 != 0) {
              memmove(ppuVar6,pppuVar8[uVar14 - 1],lVar15 * 8);
              pppuVar8 = (pvVar9->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pppuVar5 = (pvVar9->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
            }
            ppuVar6 = ppuVar6 + lVar15;
            lVar15 = lVar15 * 2;
            uVar14 = uVar14 + 1;
          } while (uVar14 < (ulong)((long)pppuVar5 - (long)pppuVar8 >> 3));
        }
        __n = (long)pvVar9->_insertpos - (long)pppuVar5[-1];
        if (__n != 0) {
          memmove(ppuVar6,pppuVar5[-1],__n);
        }
        lVar10 = lVar10 + sVar7;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
    lVar4 = 0;
    do {
      vector_bagwell<unsigned_char_*,_16U>::clear
                ((vector_bagwell<unsigned_char_*,_16U> *)
                 ((long)&(buckets->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0x2800);
    lVar4 = 1;
    sVar7 = local_838[0];
    do {
      n_00 = local_838[lVar4];
      if (n_00 != 0) {
        msd_D<vector_bagwell<unsigned_char*,16u>,unsigned_long>
                  (strings + sVar7,n_00,depth + 1,buckets);
        sVar7 = sVar7 + n_00;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}